

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_decoder.c
# Opt level: O3

lzma_ret delta_decode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  char cVar1;
  size_t sVar2;
  lzma_ret lVar3;
  byte bVar4;
  ulong uVar5;
  uint8_t uVar6;
  size_t sVar7;
  
  if (*(code **)((long)coder_ptr + 0x18) != (code *)0x0) {
    sVar7 = *out_pos;
    lVar3 = (**(code **)((long)coder_ptr + 0x18))(*coder_ptr);
    sVar2 = *out_pos;
    if (sVar2 != sVar7) {
      cVar1 = *(char *)((long)coder_ptr + 0x48);
      bVar4 = *(byte *)((long)coder_ptr + 0x50);
      do {
        uVar6 = out[sVar7] + *(char *)((long)coder_ptr + (ulong)(byte)(cVar1 + bVar4) + 0x51);
        out[sVar7] = uVar6;
        uVar5 = (ulong)bVar4;
        bVar4 = bVar4 - 1;
        *(uint8_t *)((long)coder_ptr + uVar5 + 0x51) = uVar6;
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
      *(byte *)((long)coder_ptr + 0x50) = bVar4;
    }
    return lVar3;
  }
  __assert_fail("coder->next.code != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/delta/delta_decoder.c"
                ,0x25,
                "lzma_ret delta_decode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
               );
}

Assistant:

static lzma_ret
delta_decode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_delta_coder *coder = coder_ptr;

	assert(coder->next.code != NULL);

	const size_t out_start = *out_pos;

	const lzma_ret ret = coder->next.code(coder->next.coder, allocator,
			in, in_pos, in_size, out, out_pos, out_size,
			action);

	decode_buffer(coder, out + out_start, *out_pos - out_start);

	return ret;
}